

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

endpoint_t * __thiscall zmq::ctx_t::find_endpoint(ctx_t *this,char *addr_)

{
  bool bVar1;
  iterator this_00;
  int *piVar2;
  endpoint_t *in_RDI;
  iterator it;
  scoped_lock_t locker;
  endpoint_t *endpoint;
  endpoint_t *in_stack_ffffffffffffff48;
  scoped_lock_t *in_stack_ffffffffffffff50;
  endpoint_t *this_01;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Self local_68 [3];
  allocator<char> local_49;
  string local_48 [32];
  _Self local_28 [5];
  
  this_01 = in_RDI;
  scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffff50,(mutex_t *)in_stack_ffffffffffffff48);
  __a = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),__a);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
                    *)in_stack_ffffffffffffff48,(key_type *)0x1d620e);
  local_28[0]._M_node = this_00._M_node;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==(local_28,local_68);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x6f;
    in_RDI->socket = (socket_base_t *)0x0;
    options_t::options_t((options_t *)this_01);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>
                  *)0x1d630c);
    endpoint_t::endpoint_t((endpoint_t *)this_00._M_node,in_stack_ffffffffffffff48);
    own_t::inc_seqnum((own_t *)0x1d632c);
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d6377);
  return this_01;
}

Assistant:

zmq::endpoint_t zmq::ctx_t::find_endpoint (const char *addr_)
{
    scoped_lock_t locker (_endpoints_sync);

    endpoints_t::iterator it = _endpoints.find (addr_);
    if (it == _endpoints.end ()) {
        errno = ECONNREFUSED;
        endpoint_t empty = {NULL, options_t ()};
        return empty;
    }
    endpoint_t endpoint = it->second;

    //  Increment the command sequence number of the peer so that it won't
    //  get deallocated until "bind" command is issued by the caller.
    //  The subsequent 'bind' has to be called with inc_seqnum parameter
    //  set to false, so that the seqnum isn't incremented twice.
    endpoint.socket->inc_seqnum ();

    return endpoint;
}